

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c,Allocator *allocator)

{
  size_t _elemsize;
  int _w_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Mat tmp;
  Mat local_68;
  
  _w_00 = this->h * this->w * this->c;
  iVar1 = _h * _w;
  if (_w_00 == iVar1 * _c) {
    if (this->dims < 3) {
      _elemsize = this->elemsize;
      if ((long)_h * (long)_w - (_elemsize * (long)iVar1 + 0xf & 0xfffffffffffffff0) / _elemsize !=
          0) {
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->elemsize = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->cstep = 0;
        create(__return_storage_ptr__,_w,_h,_c,_elemsize,allocator);
        uVar2 = 0;
        if (_c < 1) {
          _c = uVar2;
        }
        for (uVar3 = 0; (uint)_c != uVar3; uVar3 = uVar3 + 1) {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar3 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(this->elemsize * (long)(int)uVar2 + (long)this->data),
                 this->elemsize * (long)iVar1);
          uVar2 = uVar2 + iVar1;
        }
        return __return_storage_ptr__;
      }
    }
    else if (this->c != _c) {
      reshape(&local_68,this,_w_00,allocator);
      reshape(__return_storage_ptr__,&local_68,_w,_h,_c,allocator);
      ~Mat(&local_68);
      return __return_storage_ptr__;
    }
    Mat(__return_storage_ptr__,this);
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         ((long)iVar1 * this->elemsize + 0xf & 0xfffffffffffffff0) / this->elemsize;
  }
  else {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c, Allocator* allocator) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, allocator);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, allocator);
        return tmp.reshape(_w, _h, _c, allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}